

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::setup_conservation_tags(Mesh *mesh,AdaptOpts *opts)

{
  bool bVar1;
  Int ent_dim;
  Int IVar2;
  LO LVar3;
  int iVar4;
  TagBase *pTVar5;
  string *psVar6;
  undefined8 uVar7;
  pointer ppVar8;
  allocator local_199;
  string local_198 [32];
  Read<double> local_178;
  int local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [4];
  Int ncomps_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name_1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  string local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> momentum_name;
  string local_118 [8];
  string velocity_name;
  TagBase *tagbase_1;
  Int tagi_1;
  Read<double> local_c8;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [4];
  Int ncomps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  string local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integral_name;
  _Self local_70 [3];
  _Self local_58;
  const_iterator it;
  string density_name;
  TagBase *tagbase;
  Int tagi;
  Int dim;
  TransferOpts *xfer_opts;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  
  ent_dim = Mesh::dim(mesh);
  tagbase._0_4_ = 0;
  do {
    IVar2 = Mesh::ntags(mesh,ent_dim);
    if (IVar2 <= (int)tagbase) {
      for (tagbase_1._0_4_ = 0; iVar4 = (int)tagbase_1, IVar2 = Mesh::ntags(mesh,0), iVar4 < IVar2;
          tagbase_1._0_4_ = (int)tagbase_1 + 1) {
        pTVar5 = Mesh::get_tag(mesh,0,(int)tagbase_1);
        bVar1 = is_momentum_velocity(mesh,&opts->xfer_opts,0,pTVar5);
        if (bVar1) {
          psVar6 = TagBase::name_abi_cxx11_(pTVar5);
          std::__cxx11::string::string(local_118,(string *)psVar6);
          local_140._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&(opts->xfer_opts).velocity_momentum_map,(key_type *)local_118);
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_140);
          std::__cxx11::string::string(local_138,(string *)&ppVar8->second);
          std::operator+(local_160,(char *)local_138);
          IVar2 = TagBase::ncomps(pTVar5);
          local_164 = IVar2;
          LVar3 = Mesh::nelems(mesh);
          iVar4 = LVar3 * local_164;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_198,"",&local_199);
          Read<double>::Read(&local_178,iVar4,0.0,(string *)local_198);
          Mesh::add_tag<double>(mesh,ent_dim,local_160,IVar2,&local_178,false);
          Read<double>::~Read(&local_178);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string(local_138);
          std::__cxx11::string::~string(local_118);
        }
      }
      return;
    }
    pTVar5 = Mesh::get_tag(mesh,ent_dim,(int)tagbase);
    bVar1 = should_conserve(mesh,&opts->xfer_opts,ent_dim,pTVar5);
    if (bVar1) {
      psVar6 = TagBase::name_abi_cxx11_(pTVar5);
      std::__cxx11::string::string((string *)&it,(string *)psVar6);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(opts->xfer_opts).integral_map,(key_type *)&it);
      local_70[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&(opts->xfer_opts).integral_map);
      bVar1 = std::operator==(&local_58,local_70);
      if (bVar1) {
        uVar7 = std::__cxx11::string::c_str();
        fail("conserved density \"%s\" has no integral_map entry\n",uVar7);
      }
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_58);
      std::__cxx11::string::string(local_90,(string *)&ppVar8->second);
      std::operator+(local_b0,(char *)local_90);
      IVar2 = TagBase::ncomps(pTVar5);
      local_b4 = IVar2;
      LVar3 = Mesh::nelems(mesh);
      iVar4 = LVar3 * local_b4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&tagi_1,"",(allocator *)((long)&tagbase_1 + 7));
      Read<double>::Read(&local_c8,iVar4,0.0,(string *)&tagi_1);
      Mesh::add_tag<double>(mesh,ent_dim,local_b0,IVar2,&local_c8,false);
      Read<double>::~Read(&local_c8);
      std::__cxx11::string::~string((string *)&tagi_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tagbase_1 + 7));
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string((string *)&it);
    }
    tagbase._0_4_ = (int)tagbase + 1;
  } while( true );
}

Assistant:

void setup_conservation_tags(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      auto it = xfer_opts.integral_map.find(density_name);
      if (it == xfer_opts.integral_map.end()) {
        Omega_h_fail("conserved density \"%s\" has no integral_map entry\n",
            density_name.c_str());
      }
      auto integral_name = it->second;
      auto error_name = integral_name + "_error";
      auto ncomps = tagbase->ncomps();
      mesh->add_tag(
          dim, error_name, ncomps, Reals(mesh->nelems() * ncomps, 0.0));
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      auto velocity_name = tagbase->name();
      auto momentum_name =
          xfer_opts.velocity_momentum_map.find(velocity_name)->second;
      auto error_name = momentum_name + "_error";
      auto ncomps = tagbase->ncomps();
      mesh->add_tag(
          dim, error_name, ncomps, Reals(mesh->nelems() * ncomps, 0.0));
    }
  }
}